

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O1

int mbedtls_internal_sha256_process(mbedtls_sha256_context_conflict *ctx,uchar *data)

{
  uint uVar1;
  uint32_t *puVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint auStack_190 [9];
  uint auStack_16c [6];
  int local_154;
  uint auStack_150 [64];
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_40 = *(undefined8 *)(ctx->state + 4);
  uStack_38 = *(undefined8 *)(ctx->state + 6);
  local_50 = *(undefined8 *)ctx->state;
  uStack_48 = *(undefined8 *)(ctx->state + 2);
  puVar2 = K;
  uVar4 = 0;
  do {
    if (uVar4 < 0x10) {
      uVar5 = *(uint *)(data + uVar4 * 4);
      uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    }
    else {
      uVar5 = auStack_190[uVar4 + 1];
      uVar1 = auStack_16c[uVar4 + 5];
      uVar5 = (uVar1 >> 10 ^ (uVar1 << 0xd | uVar1 >> 0x13) ^ (uVar1 << 0xf | uVar1 >> 0x11)) +
              auStack_16c[uVar4] + auStack_190[uVar4] +
              (uVar5 >> 3 ^ (uVar5 << 0xe | uVar5 >> 0x12) ^ (uVar5 << 0x19 | uVar5 >> 7));
    }
    auStack_16c[uVar4 + 7] = uVar5;
    iVar6 = (((uint)local_40 << 7 | (uint)local_40 >> 0x19) ^
            ((uint)local_40 << 0x15 | (uint)local_40 >> 0xb) ^
            ((uint)local_40 << 0x1a | (uint)local_40 >> 6)) + uStack_38._4_4_ + *puVar2 +
            ((local_40._4_4_ ^ (uint)uStack_38) & (uint)local_40 ^ (uint)uStack_38) + uVar5;
    local_154 = ((local_50._4_4_ | (uint)local_50) & (uint)uStack_48 |
                local_50._4_4_ & (uint)local_50) +
                (((uint)local_50 << 10 | (uint)local_50 >> 0x16) ^
                ((uint)local_50 << 0x13 | (uint)local_50 >> 0xd) ^
                ((uint)local_50 << 0x1e | (uint)local_50 >> 2));
    auStack_16c[5] = local_154 + iVar6;
    uStack_38 = CONCAT44((uint)uStack_38,local_40._4_4_);
    local_40 = CONCAT44((uint)local_40,iVar6 + uStack_48._4_4_);
    uStack_48 = CONCAT44((uint)uStack_48,local_50._4_4_);
    local_50 = CONCAT44((uint)local_50,auStack_16c[5]);
    uVar4 = uVar4 + 1;
    puVar2 = puVar2 + 1;
  } while (uVar4 != 0x40);
  lVar3 = 0;
  do {
    ctx->state[lVar3] = ctx->state[lVar3] + *(int *)((long)&local_50 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  auStack_16c[3] = 0x224a8c;
  auStack_16c[4] = 0;
  mbedtls_platform_zeroize(auStack_16c + 5,0x128);
  return 0;
}

Assistant:

int mbedtls_internal_sha256_process_c(mbedtls_sha256_context *ctx,
                                      const unsigned char data[SHA256_BLOCK_SIZE])
{
    struct {
        uint32_t temp1, temp2, W[64];
        uint32_t A[8];
    } local;

    unsigned int i;

    for (i = 0; i < 8; i++) {
        local.A[i] = ctx->state[i];
    }

#if defined(MBEDTLS_SHA256_SMALLER)
    for (i = 0; i < 64; i++) {
        if (i < 16) {
            local.W[i] = MBEDTLS_GET_UINT32_BE(data, 4 * i);
        } else {
            R(i);
        }

        P(local.A[0], local.A[1], local.A[2], local.A[3], local.A[4],
          local.A[5], local.A[6], local.A[7], local.W[i], K[i]);

        local.temp1 = local.A[7]; local.A[7] = local.A[6];
        local.A[6] = local.A[5]; local.A[5] = local.A[4];
        local.A[4] = local.A[3]; local.A[3] = local.A[2];
        local.A[2] = local.A[1]; local.A[1] = local.A[0];
        local.A[0] = local.temp1;
    }
#else /* MBEDTLS_SHA256_SMALLER */
    for (i = 0; i < 16; i++) {
        local.W[i] = MBEDTLS_GET_UINT32_BE(data, 4 * i);
    }

    for (i = 0; i < 16; i += 8) {
        P(local.A[0], local.A[1], local.A[2], local.A[3], local.A[4],
          local.A[5], local.A[6], local.A[7], local.W[i+0], K[i+0]);
        P(local.A[7], local.A[0], local.A[1], local.A[2], local.A[3],
          local.A[4], local.A[5], local.A[6], local.W[i+1], K[i+1]);
        P(local.A[6], local.A[7], local.A[0], local.A[1], local.A[2],
          local.A[3], local.A[4], local.A[5], local.W[i+2], K[i+2]);
        P(local.A[5], local.A[6], local.A[7], local.A[0], local.A[1],
          local.A[2], local.A[3], local.A[4], local.W[i+3], K[i+3]);
        P(local.A[4], local.A[5], local.A[6], local.A[7], local.A[0],
          local.A[1], local.A[2], local.A[3], local.W[i+4], K[i+4]);
        P(local.A[3], local.A[4], local.A[5], local.A[6], local.A[7],
          local.A[0], local.A[1], local.A[2], local.W[i+5], K[i+5]);
        P(local.A[2], local.A[3], local.A[4], local.A[5], local.A[6],
          local.A[7], local.A[0], local.A[1], local.W[i+6], K[i+6]);
        P(local.A[1], local.A[2], local.A[3], local.A[4], local.A[5],
          local.A[6], local.A[7], local.A[0], local.W[i+7], K[i+7]);
    }

    for (i = 16; i < 64; i += 8) {
        P(local.A[0], local.A[1], local.A[2], local.A[3], local.A[4],
          local.A[5], local.A[6], local.A[7], R(i+0), K[i+0]);
        P(local.A[7], local.A[0], local.A[1], local.A[2], local.A[3],
          local.A[4], local.A[5], local.A[6], R(i+1), K[i+1]);
        P(local.A[6], local.A[7], local.A[0], local.A[1], local.A[2],
          local.A[3], local.A[4], local.A[5], R(i+2), K[i+2]);
        P(local.A[5], local.A[6], local.A[7], local.A[0], local.A[1],
          local.A[2], local.A[3], local.A[4], R(i+3), K[i+3]);
        P(local.A[4], local.A[5], local.A[6], local.A[7], local.A[0],
          local.A[1], local.A[2], local.A[3], R(i+4), K[i+4]);
        P(local.A[3], local.A[4], local.A[5], local.A[6], local.A[7],
          local.A[0], local.A[1], local.A[2], R(i+5), K[i+5]);
        P(local.A[2], local.A[3], local.A[4], local.A[5], local.A[6],
          local.A[7], local.A[0], local.A[1], R(i+6), K[i+6]);
        P(local.A[1], local.A[2], local.A[3], local.A[4], local.A[5],
          local.A[6], local.A[7], local.A[0], R(i+7), K[i+7]);
    }
#endif /* MBEDTLS_SHA256_SMALLER */

    for (i = 0; i < 8; i++) {
        ctx->state[i] += local.A[i];
    }

    /* Zeroise buffers and variables to clear sensitive data from memory. */
    mbedtls_platform_zeroize(&local, sizeof(local));

    return 0;
}